

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O1

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<16,_13,_13>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int i;
  float *pfVar1;
  long lVar2;
  undefined4 *puVar3;
  long lVar4;
  long lVar5;
  undefined4 uVar6;
  Vector<float,_3> res_1;
  Vector<float,_3> res_2;
  Vector<float,_3> res;
  Type in1;
  Type in0;
  Vec4 *local_140;
  ulong local_138;
  float local_130 [6];
  float local_118 [4];
  float local_108 [6];
  float local_f0 [3];
  float local_e4 [3];
  Matrix<float,_4,_4> local_d8;
  Matrix<float,_4,_4> local_98;
  Matrix<float,_4,_4> local_50;
  
  pfVar1 = (float *)&local_98;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar2 = 0;
    lVar4 = 0;
    do {
      lVar5 = 0;
      do {
        uVar6 = 0x3f800000;
        if (lVar2 != lVar5) {
          uVar6 = 0;
        }
        *(undefined4 *)((long)pfVar1 + lVar5) = uVar6;
        lVar5 = lVar5 + 0x10;
      } while (lVar5 != 0x40);
      lVar4 = lVar4 + 1;
      pfVar1 = pfVar1 + 1;
      lVar2 = lVar2 + 0x10;
    } while (lVar4 != 4);
    local_98.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    local_98.m_data.m_data[0].m_data._8_8_ = *(undefined8 *)(evalCtx->in[0].m_data + 2);
    local_98.m_data.m_data[1].m_data._0_8_ = *(undefined8 *)evalCtx->in[1].m_data;
    local_98.m_data.m_data[1].m_data._8_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 2);
    local_98.m_data.m_data[2].m_data._0_8_ = *(undefined8 *)evalCtx->in[2].m_data;
    local_98.m_data.m_data[2].m_data._8_8_ = *(undefined8 *)(evalCtx->in[2].m_data + 2);
    local_98.m_data.m_data[3].m_data._0_8_ = *(undefined8 *)evalCtx->in[3].m_data;
    local_98.m_data.m_data[3].m_data._8_8_ = *(undefined8 *)(evalCtx->in[3].m_data + 2);
  }
  else {
    local_98.m_data.m_data[3].m_data[0] = 0.0;
    local_98.m_data.m_data[3].m_data[1] = 0.0;
    local_98.m_data.m_data[3].m_data[2] = 0.0;
    local_98.m_data.m_data[3].m_data[3] = 0.0;
    local_98.m_data.m_data[2].m_data[0] = 0.0;
    local_98.m_data.m_data[2].m_data[1] = 0.0;
    local_98.m_data.m_data[2].m_data[2] = 0.0;
    local_98.m_data.m_data[2].m_data[3] = 0.0;
    local_98.m_data.m_data[1].m_data[0] = 0.0;
    local_98.m_data.m_data[1].m_data[1] = 0.0;
    local_98.m_data.m_data[1].m_data[2] = 0.0;
    local_98.m_data.m_data[1].m_data[3] = 0.0;
    local_98.m_data.m_data[0].m_data[0] = 0.0;
    local_98.m_data.m_data[0].m_data[1] = 0.0;
    local_98.m_data.m_data[0].m_data[2] = 0.0;
    local_98.m_data.m_data[0].m_data[3] = 0.0;
    puVar3 = &sr::(anonymous_namespace)::s_constInMat4x4;
    lVar2 = 0;
    do {
      lVar4 = 0;
      do {
        pfVar1[lVar4] = *(float *)((long)puVar3 + lVar4);
        lVar4 = lVar4 + 4;
      } while (lVar4 != 0x10);
      lVar2 = lVar2 + 1;
      pfVar1 = pfVar1 + 1;
      puVar3 = puVar3 + 4;
    } while (lVar2 != 4);
  }
  pfVar1 = (float *)&local_d8;
  if (in1Type == INPUTTYPE_DYNAMIC) {
    lVar2 = 0;
    lVar4 = 0;
    do {
      lVar5 = 0;
      do {
        uVar6 = 0x3f800000;
        if (lVar2 != lVar5) {
          uVar6 = 0;
        }
        *(undefined4 *)((long)pfVar1 + lVar5) = uVar6;
        lVar5 = lVar5 + 0x10;
      } while (lVar5 != 0x40);
      lVar4 = lVar4 + 1;
      pfVar1 = pfVar1 + 1;
      lVar2 = lVar2 + 0x10;
    } while (lVar4 != 4);
    local_d8.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    local_d8.m_data.m_data[0].m_data._8_8_ = *(undefined8 *)(evalCtx->in[0].m_data + 2);
    local_d8.m_data.m_data[1].m_data._0_8_ = *(undefined8 *)evalCtx->in[1].m_data;
    local_d8.m_data.m_data[1].m_data._8_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 2);
    local_d8.m_data.m_data[2].m_data._0_8_ = *(undefined8 *)evalCtx->in[2].m_data;
    local_d8.m_data.m_data[2].m_data._8_8_ = *(undefined8 *)(evalCtx->in[2].m_data + 2);
    local_d8.m_data.m_data[3].m_data._0_8_ = *(undefined8 *)evalCtx->in[3].m_data;
    local_d8.m_data.m_data[3].m_data._8_8_ = *(undefined8 *)(evalCtx->in[3].m_data + 2);
  }
  else {
    local_d8.m_data.m_data[3].m_data[0] = 0.0;
    local_d8.m_data.m_data[3].m_data[1] = 0.0;
    local_d8.m_data.m_data[3].m_data[2] = 0.0;
    local_d8.m_data.m_data[3].m_data[3] = 0.0;
    local_d8.m_data.m_data[2].m_data[0] = 0.0;
    local_d8.m_data.m_data[2].m_data[1] = 0.0;
    local_d8.m_data.m_data[2].m_data[2] = 0.0;
    local_d8.m_data.m_data[2].m_data[3] = 0.0;
    local_d8.m_data.m_data[1].m_data[0] = 0.0;
    local_d8.m_data.m_data[1].m_data[1] = 0.0;
    local_d8.m_data.m_data[1].m_data[2] = 0.0;
    local_d8.m_data.m_data[1].m_data[3] = 0.0;
    local_d8.m_data.m_data[0].m_data[0] = 0.0;
    local_d8.m_data.m_data[0].m_data[1] = 0.0;
    local_d8.m_data.m_data[0].m_data[2] = 0.0;
    local_d8.m_data.m_data[0].m_data[3] = 0.0;
    puVar3 = &DAT_00b4c4c0;
    lVar2 = 0;
    do {
      lVar4 = 0;
      do {
        pfVar1[lVar4] = *(float *)((long)puVar3 + lVar4);
        lVar4 = lVar4 + 4;
      } while (lVar4 != 0x10);
      lVar2 = lVar2 + 1;
      pfVar1 = pfVar1 + 1;
      puVar3 = puVar3 + 4;
    } while (lVar2 != 4);
  }
  tcu::operator-(&local_50,&local_98,&local_d8);
  local_e4[0] = local_50.m_data.m_data[0].m_data[0];
  local_e4[1] = local_50.m_data.m_data[0].m_data[1];
  local_e4[2] = local_50.m_data.m_data[0].m_data[2];
  local_f0[0] = local_50.m_data.m_data[1].m_data[1];
  local_f0[1] = local_50.m_data.m_data[1].m_data[2];
  local_f0[2] = local_50.m_data.m_data[1].m_data[3];
  local_118[0] = 0.0;
  local_118[1] = 0.0;
  local_118[2] = 0.0;
  lVar2 = 0;
  do {
    local_118[lVar2] = local_108[lVar2 + 9] + local_108[lVar2 + 6];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_108[3] = local_50.m_data.m_data[2].m_data[2];
  local_108[4] = local_50.m_data.m_data[2].m_data[3];
  local_108[5] = local_50.m_data.m_data[2].m_data[0];
  local_140 = (Vec4 *)0x0;
  local_138 = local_138 & 0xffffffff00000000;
  lVar2 = 0;
  do {
    *(float *)((long)&local_140 + lVar2 * 4) = local_118[lVar2] + local_108[lVar2 + 3];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_108[0] = local_50.m_data.m_data[3].m_data[3];
  local_108[1] = local_50.m_data.m_data[3].m_data[0];
  local_108[2] = local_50.m_data.m_data[3].m_data[1];
  local_130[2] = 0.0;
  local_130[3] = 0.0;
  local_130[4] = 0.0;
  lVar2 = 0;
  do {
    local_130[lVar2 + 2] = *(float *)((long)&local_140 + lVar2 * 4) + local_108[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_140 = &evalCtx->color;
  local_138 = 0x100000000;
  local_130[0] = 2.8026e-45;
  lVar2 = 2;
  do {
    (evalCtx->color).m_data[*(int *)((long)&local_140 + lVar2 * 4)] = local_130[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 - in1);
	}